

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O3

bool __thiscall
VmaDefragmentationContext_T::ComputeDefragmentation_Balanced
          (VmaDefragmentationContext_T *this,VmaBlockVector *vector,size_t index,bool update)

{
  size_t sVar1;
  VmaDeviceMemoryBlock *pBlock;
  VmaBlockMetadata *pVVar2;
  VmaBlockMetadata *pVVar3;
  VmaDefragmentationMove *pVVar4;
  VkDeviceSize alignment;
  VmaSuballocationType suballocType;
  byte bVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  VkResult VVar9;
  ulong uVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar12;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  size_t sVar13;
  undefined7 in_register_00000009;
  ulong uVar14;
  uint uVar15;
  VmaAllocationCreateFlags VVar16;
  size_t end;
  StateBalanced *state;
  ulong uVar17;
  MoveAllocationData moveData;
  VmaAllocationRequest local_68;
  long lVar11;
  undefined4 extraout_var_01;
  
  state = (StateBalanced *)(index * 0x10 + (long)this->m_AlgorithmState);
  if (((int)CONCAT71(in_register_00000009,update) != 0) &&
     (state->avgAllocSize == 0xffffffffffffffff)) {
    UpdateVectorStatistics(this,vector,state);
  }
  sVar1 = (this->m_Moves).m_Count;
  end = (vector->m_Blocks).m_Count - 1;
  sVar13 = sVar1;
  if (this->m_ImmovableBlockCount < end) {
    uVar10 = state->avgFreeSize >> 1;
    do {
      pBlock = (vector->m_Blocks).m_pArray[end];
      pVVar2 = pBlock->m_pMetadata;
      iVar7 = (*pVVar2->_vptr_VmaBlockMetadata[0xb])(pVVar2);
      lVar11 = CONCAT44(extraout_var,iVar7);
      if (lVar11 != 0) {
        uVar17 = 0;
        do {
          moveData.move.operation = VMA_DEFRAGMENTATION_MOVE_OPERATION_COPY;
          moveData.move.dstTmpAllocation = (VmaAllocation)0x0;
          iVar7 = (*pVVar2->_vptr_VmaBlockMetadata[10])(pVVar2,lVar11);
          moveData.move.srcAllocation = (VmaAllocation)CONCAT44(extraout_var_00,iVar7);
          moveData.size = (moveData.move.srcAllocation)->m_Size;
          moveData.alignment = (moveData.move.srcAllocation)->m_Alignment;
          moveData.type = (VmaSuballocationType)(moveData.move.srcAllocation)->m_SuballocationType;
          VVar16 = ((moveData.move.srcAllocation)->m_Flags & 1) * 4;
          moveData.flags = VVar16 + 0xc00;
          if (((moveData.move.srcAllocation)->m_Flags & 2) == 0) {
            moveData.flags = VVar16;
          }
          uVar12 = uVar17;
          if ((VmaDefragmentationContext_T *)(moveData.move.srcAllocation)->m_pUserData != this) {
            if (this->m_MaxPassBytes < moveData.size + (this->m_PassStats).bytesMoved) {
              bVar5 = this->m_IgnoredAllocs + 1;
              this->m_IgnoredAllocs = bVar5;
              if (0xf < bVar5) {
                return true;
              }
            }
            else {
              sVar13 = (this->m_Moves).m_Count;
              bVar6 = AllocInOtherBlock(this,0,end,&moveData,vector);
              if (bVar6) {
                return true;
              }
              iVar7 = (*pVVar2->_vptr_VmaBlockMetadata[0xd])(pVVar2,lVar11);
              uVar12 = CONCAT44(extraout_var_01,iVar7);
              if ((moveData.move.srcAllocation)->m_Type == '\x01') {
                pVVar3 = (((moveData.move.srcAllocation)->field_0).m_BlockAllocation.m_Block)->
                         m_pMetadata;
                iVar7 = (*pVVar3->_vptr_VmaBlockMetadata[9])
                                  (pVVar3,((moveData.move.srcAllocation)->field_0).m_BlockAllocation
                                          .m_AllocHandle);
                if ((((CONCAT44(extraout_var_02,iVar7) != 0) && (sVar13 == (this->m_Moves).m_Count))
                    && (iVar8 = (*pVVar2->_vptr_VmaBlockMetadata[6])(pVVar2),
                       suballocType = moveData.type, alignment = moveData.alignment,
                       moveData.size <= CONCAT44(extraout_var_03,iVar8))) &&
                   (((uVar10 <= uVar17 || (uVar10 <= uVar12)) ||
                    ((moveData.size <= state->avgFreeSize || (moveData.size <= state->avgAllocSize))
                    )))) {
                  local_68.customData = (void *)0x0;
                  local_68.algorithmData = 0;
                  local_68.item.m_pList = (VmaRawList<VmaSuballocation> *)0x0;
                  local_68.item.m_pItem = (VmaListItem<VmaSuballocation> *)0x0;
                  local_68.allocHandle = (VmaAllocHandle)0x0;
                  local_68.size = 0;
                  local_68.type = Normal;
                  iVar8 = (*pVVar2->_vptr_VmaBlockMetadata[0x11])(pVVar2);
                  if ((((char)iVar8 != '\0') &&
                      (iVar8 = (*pVVar2->_vptr_VmaBlockMetadata[9])(pVVar2,local_68.allocHandle),
                      CONCAT44(extraout_var_04,iVar8) < CONCAT44(extraout_var_02,iVar7))) &&
                     (VVar9 = VmaBlockVector::CommitAllocationRequest
                                        (vector,&local_68,pBlock,alignment,moveData.flags,this,
                                         suballocType,&moveData.move.dstTmpAllocation),
                     VVar9 == VK_SUCCESS)) {
                    sVar13 = (this->m_Moves).m_Count;
                    VmaVector<VmaDefragmentationMove,_VmaStlAllocator<VmaDefragmentationMove>_>::
                    resize(&this->m_Moves,sVar13 + 1);
                    pVVar4 = (this->m_Moves).m_pArray;
                    pVVar4[sVar13].dstTmpAllocation = moveData.move.dstTmpAllocation;
                    pVVar4 = pVVar4 + sVar13;
                    *(ulong *)pVVar4 = CONCAT44(moveData.move._4_4_,moveData.move.operation);
                    pVVar4->srcAllocation = moveData.move.srcAllocation;
                    uVar17 = this->m_MaxPassBytes;
                    uVar14 = (this->m_PassStats).bytesMoved + moveData.size;
                    (this->m_PassStats).bytesMoved = uVar14;
                    uVar15 = (this->m_PassStats).allocationsMoved + 1;
                    (this->m_PassStats).allocationsMoved = uVar15;
                    if (this->m_MaxPassAllocations <= uVar15) {
                      return true;
                    }
                    if (uVar17 <= uVar14) {
                      return true;
                    }
                  }
                }
              }
            }
          }
          uVar17 = uVar12;
          iVar7 = (*pVVar2->_vptr_VmaBlockMetadata[0xc])(pVVar2,lVar11);
          lVar11 = CONCAT44(extraout_var_05,iVar7);
        } while (lVar11 != 0);
      }
      end = end - 1;
    } while (this->m_ImmovableBlockCount < end);
    sVar13 = (this->m_Moves).m_Count;
  }
  if (sVar1 == sVar13 && !update) {
    state->avgAllocSize = 0xffffffffffffffff;
    bVar6 = ComputeDefragmentation_Balanced(this,vector,index,false);
  }
  else {
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool VmaDefragmentationContext_T::ComputeDefragmentation_Balanced(VmaBlockVector& vector, size_t index, bool update)
{
    // Go over every allocation and try to fit it in previous blocks at lowest offsets,
    // if not possible: realloc within single block to minimize offset (exclude offset == 0),
    // but only if there are noticable gaps between them (some heuristic, ex. average size of allocation in block)
    VMA_ASSERT(m_AlgorithmState != VMA_NULL);

    StateBalanced& vectorState = reinterpret_cast<StateBalanced*>(m_AlgorithmState)[index];
    if (update && vectorState.avgAllocSize == UINT64_MAX)
        UpdateVectorStatistics(vector, vectorState);

    const size_t startMoveCount = m_Moves.size();
    VkDeviceSize minimalFreeRegion = vectorState.avgFreeSize / 2;
    for (size_t i = vector.GetBlockCount() - 1; i > m_ImmovableBlockCount; --i)
    {
        VmaDeviceMemoryBlock* block = vector.GetBlock(i);
        VmaBlockMetadata* metadata = block->m_pMetadata;
        VkDeviceSize prevFreeRegionSize = 0;

        for (VmaAllocHandle handle = metadata->GetAllocationListBegin();
            handle != VK_NULL_HANDLE;
            handle = metadata->GetNextAllocation(handle))
        {
            MoveAllocationData moveData = GetMoveData(handle, metadata);
            // Ignore newly created allocations by defragmentation algorithm
            if (moveData.move.srcAllocation->GetUserData() == this)
                continue;
            switch (CheckCounters(moveData.move.srcAllocation->GetSize()))
            {
            case CounterStatus::Ignore:
                continue;
            case CounterStatus::End:
                return true;
            default:
                VMA_ASSERT(0);
            case CounterStatus::Pass:
                break;
            }

            // Check all previous blocks for free space
            const size_t prevMoveCount = m_Moves.size();
            if (AllocInOtherBlock(0, i, moveData, vector))
                return true;

            VkDeviceSize nextFreeRegionSize = metadata->GetNextFreeRegionSize(handle);
            // If no room found then realloc within block for lower offset
            VkDeviceSize offset = moveData.move.srcAllocation->GetOffset();
            if (prevMoveCount == m_Moves.size() && offset != 0 && metadata->GetSumFreeSize() >= moveData.size)
            {
                // Check if realloc will make sense
                if (prevFreeRegionSize >= minimalFreeRegion ||
                    nextFreeRegionSize >= minimalFreeRegion ||
                    moveData.size <= vectorState.avgFreeSize ||
                    moveData.size <= vectorState.avgAllocSize)
                {
                    VmaAllocationRequest request = {};
                    if (metadata->CreateAllocationRequest(
                        moveData.size,
                        moveData.alignment,
                        false,
                        moveData.type,
                        VMA_ALLOCATION_CREATE_STRATEGY_MIN_OFFSET_BIT,
                        &request))
                    {
                        if (metadata->GetAllocationOffset(request.allocHandle) < offset)
                        {
                            if (vector.CommitAllocationRequest(
                                request,
                                block,
                                moveData.alignment,
                                moveData.flags,
                                this,
                                moveData.type,
                                &moveData.move.dstTmpAllocation) == VK_SUCCESS)
                            {
                                m_Moves.push_back(moveData.move);
                                if (IncrementCounters(moveData.size))
                                    return true;
                            }
                        }
                    }
                }
            }
            prevFreeRegionSize = nextFreeRegionSize;
        }
    }
    
    // No moves perfomed, update statistics to current vector state
    if (startMoveCount == m_Moves.size() && !update)
    {
        vectorState.avgAllocSize = UINT64_MAX;
        return ComputeDefragmentation_Balanced(vector, index, false);
    }
    return false;
}